

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdCelsiusTlMode::emulate_mthd(MthdCelsiusTlMode *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4;
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (7 < uVar2 == 0 && uVar3 == 0) {
    if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
      uVar3 = (uVar2 & 1) << 0x1c |
              (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a &
              0xefffffff;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a = uVar3;
      uVar2 = (uVar2 & 4) * 0x4000 + (uVar2 & 2) * 2 |
              (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b &
              0xfffefffb;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b = uVar2;
      if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x10000000) ==
          0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] = uVar3
        ;
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] = uVar2
        ;
      }
    }
    return;
  }
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.notify;
  if ((uVar1 & 0x70000000) != 0) {
    return;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.notify =
       uVar1 | (7 < uVar2 | uVar3) << 0x1c;
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (val & ~7)
			err |= 1;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.celsius_xf_misc_a, 28, 1, extr(val, 0, 1));
				insrt(exp.celsius_xf_misc_b, 2, 1, extr(val, 1, 1));
				insrt(exp.celsius_xf_misc_b, 16, 1, extr(val, 2, 1));
				if (!extr(exp.debug_d, 28, 1)) {
					exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
					exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
				}
			}
		}
	}